

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O0

int CVmObjList::getp_cdr(vm_val_t *retval,vm_val_t *self_val,char *lst,uint *argc)

{
  int iVar1;
  vm_obj_id_t obj_00;
  size_t sVar2;
  char *ele_array;
  vm_val_t *in_RSI;
  vm_val_t *in_RDI;
  size_t new_cnt;
  vm_obj_id_t obj;
  CVmNativeCodeDesc *in_stack_ffffffffffffffb8;
  uint *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  CVmObjList *in_stack_ffffffffffffffd0;
  
  if ((getp_cdr(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_cdr(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::
                                   desc), iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_cdr::desc,0);
    __cxa_guard_release(&getp_cdr(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                     in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (iVar1 == 0) {
    CVmStack::push(in_RSI);
    sVar2 = vmb_get_len((char *)0x36d1a9);
    if (sVar2 == 0) {
      vm_val_t::set_nil(in_RDI);
    }
    else {
      sVar2 = vmb_get_len((char *)0x36d1c5);
      ele_array = (char *)(sVar2 - 1);
      obj_00 = create((int)((ulong)ele_array >> 0x20),(size_t)in_stack_ffffffffffffffb8);
      vm_objp(0);
      cons_copy_data(in_stack_ffffffffffffffd0,CONCAT44(in_stack_ffffffffffffffcc,obj_00),ele_array,
                     (size_t)in_stack_ffffffffffffffb8);
      vm_val_t::set_obj(in_RDI,obj_00);
    }
    CVmStack::discard();
  }
  return 1;
}

Assistant:

int CVmObjList::getp_cdr(VMG_ vm_val_t *retval, const vm_val_t *self_val,
                         const char *lst, uint *argc)
{
    static CVmNativeCodeDesc desc(0);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* push a self-reference for GC protection */
    G_stk->push(self_val);

    /* 
     *   if the list has no elements, return nil; otherwise, return the
     *   sublist starting with the second element (thus return an empty
     *   list if the original list has only one element) 
     */
    if (vmb_get_len(lst) == 0)
    {
        /* no elements - return nil */
        retval->set_nil();
    }
    else
    {
        vm_obj_id_t obj;
        size_t new_cnt;

        /* reduce the list count by one */
        new_cnt = vmb_get_len(lst) - 1;

        /* skip past the first element */
        lst += VMB_LEN + VMB_DATAHOLDER;

        /* create the new list */
        obj = create(vmg_ FALSE, new_cnt);

        /* copy the elements */
        ((CVmObjList *)vm_objp(vmg_ obj))->cons_copy_data(0, lst, new_cnt);

        /* return the new object */
        retval->set_obj(obj);
    }

    /* discard the stack protection */
    G_stk->discard();

    /* handled */
    return TRUE;
}